

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

Closure * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,Dyndata *dyd,char *name,int firstchar)

{
  StkId pTVar1;
  GCObject *pGVar2;
  TString *pTVar3;
  TValue *io;
  Closure *cl;
  FuncState funcstate;
  LexState lexstate;
  int firstchar_local;
  char *name_local;
  Dyndata *dyd_local;
  Mbuffer *buff_local;
  ZIO *z_local;
  lua_State *L_local;
  
  pGVar2 = (GCObject *)luaF_newLclosure(L,1);
  pTVar1 = L->top;
  (pTVar1->value_).gc = pGVar2;
  pTVar1->tt_ = 0x46;
  L->top = L->top + 1;
  if ((long)L->stack_last - (long)L->top >> 4 < 1) {
    luaD_growstack(L,0);
  }
  cl = (Closure *)luaF_newproto(L);
  (pGVar2->h).array = (TValue *)cl;
  pTVar3 = luaS_new(L,name);
  *(TString **)((long)cl + 0x48) = pTVar3;
  (dyd->label).n = 0;
  (dyd->gt).n = 0;
  (dyd->actvar).n = 0;
  luaX_setinput(L,(LexState *)&funcstate.nlocvars,z,*(TString **)((long)cl + 0x48),firstchar);
  mainfunc((LexState *)&funcstate.nlocvars,(FuncState *)&cl);
  return (Closure *)pGVar2;
}

Assistant:

Closure *luaY_parser (lua_State *L, ZIO *z, Mbuffer *buff,
                      Dyndata *dyd, const char *name, int firstchar) {
  LexState lexstate;
  FuncState funcstate;
  Closure *cl = luaF_newLclosure(L, 1);  /* create main closure */
  /* anchor closure (to avoid being collected) */
  setclLvalue(L, L->top, cl);
  incr_top(L);
  funcstate.f = cl->l.p = luaF_newproto(L);
  funcstate.f->source = luaS_new(L, name);  /* create and anchor TString */
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  dyd->actvar.n = dyd->gt.n = dyd->label.n = 0;
  luaX_setinput(L, &lexstate, z, funcstate.f->source, firstchar);
  mainfunc(&lexstate, &funcstate);
  lua_assert(!funcstate.prev && funcstate.nups == 1 && !lexstate.fs);
  /* all scopes should be correctly finished */
  lua_assert(dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0);
  return cl;  /* it's on the stack too */
}